

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

int match1vs1(int matches,long limit,string *command1,string *command2)

{
  bool bVar1;
  reference this;
  int local_114c;
  int result;
  exception *anon_var_0;
  __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
  local_1138;
  iterator it;
  bool end;
  int i_1;
  type local_1118;
  undefined1 *local_1108;
  string *local_1100;
  type local_10f8;
  undefined1 local_10e8 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  Forth forth2;
  undefined1 local_8c0 [8];
  Forth forth1;
  long counter;
  int ties [4];
  int wins [4];
  int local_8c;
  int local_88;
  int k;
  int j;
  int i;
  int movement;
  int m_count;
  int robotsleft;
  int num_robots;
  string *command2_local;
  string *command1_local;
  long limit_local;
  int matches_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(seq_cst,__memory_order_mask);
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  forth1.traceCalls = false;
  forth1.trace = false;
  forth1._2042_6_ = 0;
  r_debug = 0;
  for (k = 0; k < 2; k = k + 1) {
    ties[(long)k + 2] = 0;
    ties[(long)k + -2] = 0;
  }
  i = 1;
  do {
    if (matches < i) {
      local_114c = 0;
      if (ties[3] < ties[2]) {
        local_114c = 1;
      }
      else if (ties[2] < ties[3]) {
        local_114c = -1;
      }
      return local_114c;
    }
    cppforth::Forth::Forth((Forth *)local_8c0);
    InitForthRobot((Forth *)local_8c0,step);
    InsertForthToInt((Forth *)local_8c0,0);
    cppforth::Forth::Forth
              ((Forth *)&allServersThreads.
                         super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    InitForthRobot((Forth *)&allServersThreads.
                             super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,step);
    InsertForthToInt((Forth *)&allServersThreads.
                               super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_10e8);
    local_1108 = local_8c0;
    local_1100 = command1;
    std::async<match1vs1(int,long,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
              (&local_10f8);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_10e8,
               (value_type *)&local_10f8);
    std::future<void>::~future((future<void> *)&local_10f8);
    std::async<match1vs1(int,long,std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
              (&local_1118);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_10e8,
               (value_type *)&local_1118);
    std::future<void>::~future((future<void> *)&local_1118);
    for (k = 0; k < 2; k = k + 1) {
      init_robot(k);
      robots[k].status = 1;
    }
    rand_pos(2);
    j = 0xf;
    movement = 2;
    forth1.traceCalls = false;
    forth1.trace = false;
    forth1._2042_6_ = 0;
    while (1 < movement && (long)forth1._2040_8_ < limit) {
      movement = 0;
      for (k = 0; k < 2; k = k + 1) {
        if (robots[k].status == 1) {
          movement = movement + 1;
          cur_robot = robots + k;
        }
      }
      cycle(2);
      j = j + -1;
      if (j == 0) {
        forth1._2040_8_ = forth1._2040_8_ + 0xf;
        j = 0xf;
        move_robots(0);
        move_miss(0);
        for (k = 0; k < 2; k = k + 1) {
          for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
            if (missiles[k][local_88].stat == 2) {
              count_miss(k,local_88);
            }
          }
        }
      }
    }
    while( true ) {
      bVar1 = false;
      for (k = 0; k < 2; k = k + 1) {
        for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
          if (missiles[k][local_88].stat == 1) {
            bVar1 = true;
          }
        }
      }
      if (!bVar1) break;
      move_robots(0);
      move_miss(0);
    }
    local_8c = 0;
    for (k = 0; k < 2; k = k + 1) {
      if (robots[k].status == 1) {
        local_8c = local_8c + 1;
      }
    }
    for (k = 0; k < 2; k = k + 1) {
      if (robots[k].status == 1) {
        if (local_8c == 1) {
          ties[(long)k + 2] = ties[(long)k + 2] + 1;
        }
        else {
          ties[(long)k + -2] = ties[(long)k + -2] + 1;
        }
      }
    }
    std::operator&(seq_cst,__memory_order_mask);
    LOCK();
    stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
    UNLOCK();
    for (it._M_current._4_4_ = 0; it._M_current._4_4_ < 10000;
        it._M_current._4_4_ = it._M_current._4_4_ + 1) {
      it._M_current._3_1_ = '\x01';
      for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
        if (robotStatus[local_88] != StatusException) {
          it._M_current._3_1_ = '\0';
        }
      }
      if (it._M_current._3_1_ != '\0') break;
      cycle(2);
      std::this_thread::yield();
    }
    local_1138._M_current =
         (future<void> *)
         std::begin<std::vector<std::future<void>,std::allocator<std::future<void>>>>
                   ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_10e8);
    while( true ) {
      anon_var_0 = (exception *)
                   std::end<std::vector<std::future<void>,std::allocator<std::future<void>>>>
                             ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                              local_10e8);
      bVar1 = __gnu_cxx::
              operator==<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                        (&local_1138,
                         (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          *)&anon_var_0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      this = __gnu_cxx::
             __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
             ::operator*(&local_1138);
      std::future<void>::get(this);
      __gnu_cxx::
      __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
      ::operator++(&local_1138);
    }
    std::operator&(seq_cst,__memory_order_mask);
    LOCK();
    UNLOCK();
    stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_10e8);
    cppforth::Forth::~Forth
              ((Forth *)&allServersThreads.
                         super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    cppforth::Forth::~Forth((Forth *)local_8c0);
    i = i + 1;
  } while( true );
}

Assistant:

int match1vs1(int matches,
	long limit,
	const std::string &command1,
	const std::string &command2	)
{
	int num_robots = 2;
	stopAll.store(0);
	int robotsleft;
	int m_count;
	int movement;
	int i, j, k;
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);

		for (i = 0; i < num_robots; i++) {
			init_robot(i);
			// robot_go should be here
			robots[i].status = ACTIVE;
		}
		rand_pos(num_robots);
		movement = MOTION_CYCLES;
		robotsleft = num_robots;
		counter = 0L;
		while (robotsleft > 1 && counter < limit) {
			robotsleft = 0;
			for (i = 0; i < num_robots; i++) {
				if (robots[i].status == ACTIVE) {
					robotsleft++;
					cur_robot = &robots[i];
				}
			}
			cycle(num_robots);

			if (--movement == 0) {
				counter += MOTION_CYCLES;
				movement = MOTION_CYCLES;
				move_robots(0);
				move_miss(0);
				for (i = 0; i < num_robots; i++) {
					for (j = 0; j < MIS_ROBOT; j++) {
						if (missiles[i][j].stat == EXPLODING) {
							count_miss(i, j);
						}
					}
				}
			}
		}

		/* allow any flying missiles to explode */
		while (1) {
			k = 0;
			for (i = 0; i < num_robots; i++) {
				for (j = 0; j < MIS_ROBOT; j++) {
					if (missiles[i][j].stat == FLYING) {
						k = 1;
					}
				}
			}
			if (k) {
				move_robots(0);
				move_miss(0);
			}
			else
				break;
		}

		k = 0;
		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				k++;
			}
		}

		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				if (k == 1)
					wins[i]++;
				else
					ties[i]++;
			}
		}
		stopAll.store(1);
		for (int i = 0; i < 10000; ++i){
			auto end = true;
			for (j = 0; j < 2; ++j){
				if (robotStatus[j] != StatusException){
					end = false;
				}
			}
			if (end)
				break;
			cycle(num_robots);
			std::this_thread::yield();
		}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	int result{};
	if (wins[0] > wins[1]) result = 1;
	else if(wins[0] < wins[1]) result = -1;
	return result; 

}